

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

void * __thiscall
QtPrivate::QVariantTypeCoercer::convert(QVariantTypeCoercer *this,QVariant *value,QMetaType *type)

{
  byte bVar1;
  PrivateShared *pPVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QMetaType local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d_ptr = &QMetaTypeInterfaceWrapper<QVariant>::metaType;
  bVar3 = ::comparesEqual(type,&local_28);
  if (bVar3) goto LAB_002a5144;
  local_28.d_ptr = (QMetaTypeInterface *)(*(ulong *)&(value->d).field_0x18 & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(type,&local_28);
  if (bVar3) {
    bVar1 = (value->d).field_0x18;
joined_r0x002a513e:
    if ((bVar1 & 1) != 0) {
      pPVar2 = (((QVariantTypeCoercer *)value)->converted).d.data.shared;
      value = (QVariant *)
              ((long)&(pPVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
                      _q_value.super___atomic_base<int> + (long)pPVar2->offset);
    }
  }
  else {
    bVar3 = ::QVariant::canConvert(value,(QMetaType)type->d_ptr);
    if (bVar3) {
      ::QVariant::operator=(&this->converted,value);
      bVar3 = ::QVariant::convert(&this->converted,(QMetaType)type->d_ptr);
      if (bVar3) {
        bVar1 = (this->converted).d.field_0x18;
        value = &this->converted;
        goto joined_r0x002a513e;
      }
    }
    value = (QVariant *)0x0;
  }
LAB_002a5144:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (QVariantTypeCoercer *)value;
  }
  __stack_chk_fail();
}

Assistant:

const void *QtPrivate::QVariantTypeCoercer::convert(const QVariant &value, const QMetaType &type)
{
    if (type == QMetaType::fromType<QVariant>())
        return &value;

    if (type == value.metaType())
        return value.constData();

    if (value.canConvert(type)) {
        converted = value;
        if (converted.convert(type))
            return converted.constData();
    }

    return nullptr;
}